

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O0

QByteArray * QRestReplyPrivate::contentCharset(QNetworkReply *reply)

{
  bool bVar1;
  QHttpHeaders *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000070 [16];
  QByteArray contentTypeValue;
  R_conflict4 r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  undefined4 in_stack_ffffffffffffff40;
  WellKnownHeader in_stack_ffffffffffffff44;
  QByteArrayView in_stack_ffffffffffffff60;
  QByteArrayView local_88;
  QByteArrayView local_70;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = 0xaaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaaaaaaaaaa;
  local_50 = 0xaaaaaaaaaaaaaaaa;
  c = in_RDI;
  QNetworkReply::headers((QNetworkReply *)in_RDI);
  QByteArrayView::QByteArrayView(&local_88);
  local_70 = QHttpHeaders::value(in_RSI,in_stack_ffffffffffffff44,in_stack_ffffffffffffff60);
  QByteArrayView::toByteArray((QByteArrayView *)in_RDI);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x334092);
  memset(local_48,0xaa,0x40);
  QByteArrayView::QByteArrayView<QByteArray,_true>
            ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (QByteArray *)c);
  parse_content_type((QByteArrayView)in_stack_00000070);
  bVar1 = parse_content_type(QByteArrayView)::R::operator_cast_to_bool((R_conflict4 *)0x3340dc);
  if ((!bVar1) ||
     (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x3340f3), bVar1)) {
    Qt::Literals::StringLiterals::operator____ba
              ((char *)in_RSI,CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  else {
    QByteArrayView::
    QByteArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),c);
    QByteArrayView::toByteArray((QByteArrayView *)in_RDI);
  }
  R::~R((R_conflict4 *)0x334151);
  QByteArray::~QByteArray((QByteArray *)0x33415b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)c;
}

Assistant:

QByteArray QRestReplyPrivate::contentCharset(const QNetworkReply* reply)
{
    // Content-type consists of mimetype and optional parameters, of which one may be 'charset'
    // Example values and their combinations below are all valid, see RFC 7231 section 3.1.1.5
    // and RFC 2045 section 5.1
    //
    // text/plain; charset=utf-8
    // text/plain; charset=utf-8;version=1.7
    // text/plain; charset = utf-8
    // text/plain; charset ="utf-8"

    const QByteArray contentTypeValue =
            reply->headers().value(QHttpHeaders::WellKnownHeader::ContentType).toByteArray();

    const auto r = parse_content_type(contentTypeValue);
    if (r && !r.charset.empty())
        return QByteArrayView(r.charset).toByteArray();
    else
        return "UTF-8"_ba; // Default to the most commonly used UTF-8.
}